

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibString.cpp
# Opt level: O2

void lib::string::RegisterLibString(State *state)

{
  Library lib;
  TableMemberReg string [7];
  
  luna::Library::Library(&lib,state);
  string[0].name_ = "byte";
  string[0].field_1.func_ = Byte;
  string[0].type_ = ValueT_CFunction;
  string[1].name_ = "char";
  string[1].field_1.func_ = Char;
  string[2].name_ = "len";
  string[2].field_1.func_ = Len;
  string[3].name_ = "lower";
  string[3].field_1.func_ = Lower;
  string[4].name_ = "reverse";
  string[4].field_1.func_ = Reverse;
  string[5].name_ = "sub";
  string[5].field_1.func_ = Sub;
  string[6].name_ = "upper";
  string[6].field_1.func_ = Upper;
  string[1].type_ = string[0].type_;
  string[2].type_ = string[0].type_;
  string[3].type_ = string[0].type_;
  string[4].type_ = string[0].type_;
  string[5].type_ = string[0].type_;
  string[6].type_ = string[0].type_;
  luna::Library::RegisterTableFunction<7ul>(&lib,"string",&string);
  return;
}

Assistant:

void RegisterLibString(luna::State *state)
    {
        luna::Library lib(state);
        luna::TableMemberReg string[] = {
            { "byte", Byte },
            { "char", Char },
            { "len", Len },
            { "lower", Lower },
            { "reverse", Reverse },
            { "sub", Sub },
            { "upper", Upper }
        };
        lib.RegisterTableFunction("string", string);
    }